

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  unsigned_long *puVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar11;
  longdouble in_ST5;
  longdouble lVar12;
  longdouble lVar13;
  double extraout_XMM0_Qa;
  double __value;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double dVar14;
  double extraout_XMM0_Qa_07;
  double __value_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  long in_stack_00000008;
  int in_stack_00000010;
  longdouble out;
  longdouble v;
  longdouble sn;
  longdouble cnt_l;
  size_t *row_1;
  size_t *row;
  longdouble xval;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  size_t cnt;
  longdouble x_sq;
  longdouble s4;
  longdouble s3;
  longdouble s2;
  longdouble s1;
  undefined2 in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea2;
  unsigned_long *in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb2;
  double local_148;
  undefined2 uVar15;
  undefined2 in_stack_fffffffffffffeca;
  undefined1 uVar16;
  undefined1 in_stack_fffffffffffffecd;
  byte in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  size_t in_stack_fffffffffffffed0;
  size_t *ix_arr_00;
  unkbyte10 in_stack_fffffffffffffee8;
  unsigned_long *local_108;
  undefined2 uVar17;
  undefined6 in_stack_ffffffffffffff02;
  ulong *local_d8;
  ulong *local_d0;
  long local_a8;
  ulong local_90;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  double local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = -INFINITY;
  }
  else {
    local_78 = (longdouble)0;
    local_90 = (in_RDX - in_RSI) + 1;
    if (local_90 < 2) {
      local_8 = -INFINITY;
    }
    else {
      local_a8 = *(long *)(in_stack_00000008 + in_RCX * 8);
      lVar1 = *(long *)(in_stack_00000008 + 8 + in_RCX * 8);
      lVar6 = lVar1 + -1;
      uVar2 = *(ulong *)(in_R9 + lVar6 * 8);
      local_d8 = std::lower_bound<unsigned_long*,unsigned_long>
                           ((unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffea8,
                            (unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
      dVar14 = extraout_XMM0_Qa;
      local_d0 = local_d8;
      local_68 = local_78;
      local_58 = local_78;
      local_48 = local_78;
      if (in_stack_00000010 == 0) {
        while( true ) {
          ix_arr_00 = (size_t *)in_stack_fffffffffffffee8;
          in_stack_fffffffffffffecd = false;
          if ((local_d8 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (in_stack_fffffffffffffecd = false, local_a8 != lVar1)) {
            in_stack_fffffffffffffecd = *local_d8 <= uVar2;
          }
          if ((bool)in_stack_fffffffffffffecd == false) break;
          if (*(ulong *)(in_R9 + local_a8 * 8) == *local_d8) {
            lVar10 = (longdouble)*(double *)(in_R8 + local_a8 * 8);
            local_48 = local_48 + lVar10;
            dVar14 = std::fma(dVar14,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            lVar8 = in_ST5;
            lVar9 = in_ST5;
            dVar14 = std::fma(dVar14,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_stack_fffffffffffffea8 = SUB108(local_78,0);
            in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)local_78 >> 0x40);
            in_stack_fffffffffffffea0 = (undefined2)((unkuint10)(lVar10 * lVar10) >> 0x40);
            lVar10 = lVar9;
            dVar14 = std::fma(dVar14,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            ix_arr_00 = (size_t *)in_stack_fffffffffffffee8;
            local_78 = in_ST2;
            local_68 = in_ST1;
            local_58 = in_ST0;
            if ((local_d8 == (ulong *)(in_RDI + in_RDX * 8)) || (local_a8 == lVar6)) break;
            local_d8 = local_d8 + 1;
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffea8,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
            local_a8 = (long)puVar7 - in_R9 >> 3;
            in_ST0 = in_ST3;
            in_ST1 = in_ST4;
            in_ST2 = in_ST5;
            in_ST3 = lVar8;
            in_ST4 = lVar9;
            in_ST5 = lVar10;
            dVar14 = extraout_XMM0_Qa_04;
          }
          else if (*local_d8 < *(ulong *)(in_R9 + local_a8 * 8)) {
            local_d8 = std::lower_bound<unsigned_long*,unsigned_long>
                                 ((unsigned_long *)
                                  CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                  in_stack_fffffffffffffea8,
                                  (unsigned_long *)
                                  CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
            dVar14 = extraout_XMM0_Qa_05;
          }
          else {
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffea8,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
            local_a8 = (long)puVar7 - in_R9 >> 3;
            dVar14 = extraout_XMM0_Qa_06;
          }
        }
      }
      else {
        while( true ) {
          ix_arr_00 = (size_t *)in_stack_fffffffffffffee8;
          in_stack_fffffffffffffecf = false;
          if ((local_d0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (in_stack_fffffffffffffecf = false, local_a8 != lVar1)) {
            in_stack_fffffffffffffecf = *local_d0 <= uVar2;
          }
          if ((bool)in_stack_fffffffffffffecf == false) break;
          if (*(ulong *)(in_R9 + local_a8 * 8) == *local_d0) {
            lVar8 = (longdouble)*(double *)(in_R8 + local_a8 * 8);
            uVar5 = std::isnan(dVar14);
            in_stack_fffffffffffffece = 1;
            dVar14 = __value;
            if ((uVar5 & 1) == 0) {
              iVar4 = std::isinf(__value);
              in_stack_fffffffffffffece = (byte)iVar4;
              dVar14 = extraout_XMM0_Qa_00;
            }
            if ((in_stack_fffffffffffffece & 1) == 0) {
              local_48 = local_48 + lVar8;
              dVar14 = std::fma(dVar14,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              lVar11 = in_ST5;
              lVar12 = in_ST5;
              dVar14 = std::fma(dVar14,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              in_stack_fffffffffffffea8 = SUB108(local_78,0);
              in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)local_78 >> 0x40);
              in_stack_fffffffffffffea0 = (undefined2)((unkuint10)(lVar8 * lVar8) >> 0x40);
              lVar13 = lVar12;
              dVar14 = std::fma(dVar14,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
              lVar8 = in_ST3;
              lVar9 = in_ST4;
              lVar10 = in_ST5;
              in_ST3 = lVar11;
              in_ST4 = lVar12;
              in_ST5 = lVar13;
              local_78 = in_ST2;
              local_68 = in_ST1;
              local_58 = in_ST0;
            }
            else {
              local_90 = local_90 - 1;
              lVar8 = in_ST0;
              lVar9 = in_ST1;
              lVar10 = in_ST2;
            }
            ix_arr_00 = (size_t *)in_stack_fffffffffffffee8;
            if ((local_d0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_a8 == lVar6)) break;
            local_d0 = local_d0 + 1;
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffea8,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
            local_a8 = (long)puVar7 - in_R9 >> 3;
            in_ST0 = lVar8;
            in_ST1 = lVar9;
            in_ST2 = lVar10;
            dVar14 = extraout_XMM0_Qa_01;
          }
          else if (*local_d0 < *(ulong *)(in_R9 + local_a8 * 8)) {
            local_d0 = std::lower_bound<unsigned_long*,unsigned_long>
                                 ((unsigned_long *)
                                  CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                  in_stack_fffffffffffffea8,
                                  (unsigned_long *)
                                  CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
            dVar14 = extraout_XMM0_Qa_02;
          }
          else {
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffea8,
                                (unsigned_long *)
                                CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0));
            local_a8 = (long)puVar7 - in_R9 >> 3;
            dVar14 = extraout_XMM0_Qa_03;
          }
        }
        if (local_90 <=
            (ulong)(((in_RDX - in_RSI) + 1) -
                   (*(long *)(in_stack_00000008 + 8 + in_RCX * 8) -
                   *(long *)(in_stack_00000008 + in_RCX * 8)))) {
          return -INFINITY;
        }
      }
      uVar16 = true;
      if (1 < local_90) {
        uVar16 = true;
        if ((local_58 != (longdouble)0) || (NAN(local_58) || NAN((longdouble)0))) {
          uVar16 = local_48 * local_48 == local_58;
        }
      }
      if ((bool)uVar16 == false) {
        lVar8 = (longdouble)(float)(&DAT_006c0110)[(long)local_90 < 0] + (longdouble)(long)local_90;
        lVar9 = local_48 / lVar8;
        lVar10 = local_58 / lVar8 - lVar9 * lVar9;
        local_108 = SUB108(lVar10,0);
        uVar15 = (undefined2)((unkuint10)lVar10 >> 0x40);
        uVar5 = std::isnan(dVar14);
        if ((uVar5 & 1) == 0) {
          puVar7 = local_108;
          uVar17 = uVar15;
          dVar14 = std::numeric_limits<double>::epsilon();
          if (((longdouble)dVar14 < (longdouble)CONCAT28(uVar15,puVar7)) ||
             (bVar3 = check_more_than_two_unique_values<double,unsigned_long>
                                (ix_arr_00,local_90,(size_t)dVar14,in_stack_fffffffffffffed0,
                                 (unsigned_long *)
                                 CONCAT17(in_stack_fffffffffffffecf,
                                          CONCAT16(in_stack_fffffffffffffece,
                                                   CONCAT15(in_stack_fffffffffffffecd,
                                                            CONCAT14(uVar16,CONCAT22(
                                                  in_stack_fffffffffffffeca,uVar15))))),puVar7,
                                 (double *)CONCAT62(in_stack_ffffffffffffff02,uVar17),
                                 SUB104(lVar9,0)), dVar14 = extraout_XMM0_Qa_07, bVar3)) {
            if ((longdouble)CONCAT28(uVar17,local_108) <= (longdouble)0) {
              local_8 = 0.0;
            }
            else {
              lVar10 = lVar9 * lVar9 * lVar9;
              lVar8 = (lVar10 * lVar9 * lVar8 +
                      (((longdouble)6.0 * local_58 * lVar9 * lVar9 +
                       (local_78 - local_68 * (longdouble)4.0 * lVar9)) -
                      local_48 * (longdouble)4.0 * lVar10)) /
                      ((longdouble)CONCAT28(uVar17,local_108) *
                       (longdouble)CONCAT28(uVar17,local_108) * lVar8);
              uVar5 = std::isnan(dVar14);
              if (((uVar5 & 1) == 0) && (uVar5 = std::isinf(__value_00), (uVar5 & 1) == 0)) {
                local_148 = (double)lVar8;
                if (local_148 <= 0.0) {
                  local_148 = 0.0;
                }
              }
              else {
                local_148 = -INFINITY;
              }
              local_8 = local_148;
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
      else {
        local_8 = -INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}